

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdevicediscovery_udev.cpp
# Opt level: O3

void __thiscall QDeviceDiscoveryUDev::handleUDevNotification(QDeviceDiscoveryUDev *this)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  udev_device *dev;
  char *pcVar4;
  long lVar5;
  udev_device *dev_00;
  storage_type *psVar6;
  char *pcVar7;
  long in_FS_OFFSET;
  QByteArrayView QVar8;
  QLatin1String QVar9;
  QLatin1String QVar10;
  QArrayData *local_68;
  char16_t *pcStack_60;
  qsizetype local_58;
  QString local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(this + 0x20) == 0) goto LAB_0010ab08;
  local_48.d.d = (Data *)0x0;
  local_48.d.ptr = (char16_t *)0x0;
  local_48.d.size = 0;
  dev = (udev_device *)udev_monitor_receive_device();
  if (dev != (udev_device *)0x0) {
    pcVar4 = (char *)udev_device_get_action(dev);
    if (pcVar4 != (char *)0x0) {
      lVar5 = udev_device_get_devnode(dev);
      if (lVar5 != 0) {
        psVar6 = (storage_type *)0xffffffffffffffff;
        do {
          pcVar7 = psVar6 + lVar5 + 1;
          psVar6 = psVar6 + 1;
        } while (*pcVar7 != '\0');
        QVar8.m_data = psVar6;
        QVar8.m_size = (qsizetype)&local_68;
        QString::fromUtf8(QVar8);
        local_48.d.d = (Data *)local_68;
        local_48.d.ptr = pcStack_60;
        local_48.d.size = local_58;
        QVar9.m_data = (char *)0x10;
        QVar9.m_size = (qsizetype)&local_48;
        cVar1 = QString::startsWith(QVar9,0x10cadb);
        if (cVar1 == '\0') {
          QVar10.m_data = (char *)0xd;
          QVar10.m_size = (qsizetype)&local_48;
          cVar1 = QString::startsWith(QVar10,0x10caec);
          if (cVar1 == '\0') goto LAB_0010aadd;
          pcVar7 = "drm";
        }
        else {
          pcVar7 = "input";
        }
        bVar2 = checkDeviceType(this,dev);
        if (bVar2) {
LAB_0010aa9d:
          iVar3 = qstrcmp(pcVar4,"add");
          if (iVar3 == 0) {
            QDeviceDiscovery::deviceDetected((QDeviceDiscovery *)this,&local_48);
          }
          iVar3 = qstrcmp(pcVar4,"remove");
          if (iVar3 == 0) {
            QDeviceDiscovery::deviceRemoved((QDeviceDiscovery *)this,&local_48);
          }
        }
        else {
          dev_00 = (udev_device *)udev_device_get_parent_with_subsystem_devtype(dev,pcVar7,0);
          if (dev_00 != (udev_device *)0x0) {
            bVar2 = checkDeviceType(this,dev_00);
            if (bVar2) goto LAB_0010aa9d;
          }
        }
      }
    }
  }
LAB_0010aadd:
  udev_device_unref(dev);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_0010ab08:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDeviceDiscoveryUDev::handleUDevNotification()
{
    if (!m_udevMonitor)
        return;

    struct udev_device *dev;
    QString devNode;

    dev = udev_monitor_receive_device(m_udevMonitor);
    if (!dev)
        goto cleanup;

    const char *action;
    action = udev_device_get_action(dev);
    if (!action)
        goto cleanup;

    const char *str;
    str = udev_device_get_devnode(dev);
    if (!str)
        goto cleanup;

    const char *subsystem;
    devNode = QString::fromUtf8(str);
    if (devNode.startsWith(QT_EVDEV_DEVICE ""_L1))
        subsystem = "input";
    else if (devNode.startsWith(QT_DRM_DEVICE ""_L1))
        subsystem = "drm";
    else goto cleanup;

    // if we cannot determine a type, walk up the device tree
    if (!checkDeviceType(dev)) {
        // does not increase the refcount
        struct udev_device *parent_dev = udev_device_get_parent_with_subsystem_devtype(dev, subsystem, 0);
        if (!parent_dev)
            goto cleanup;

        if (!checkDeviceType(parent_dev))
            goto cleanup;
    }

    if (qstrcmp(action, "add") == 0)
        emit deviceDetected(devNode);

    if (qstrcmp(action, "remove") == 0)
        emit deviceRemoved(devNode);

cleanup:
    udev_device_unref(dev);
}